

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O0

Camera * vera::createCamera(string *_name)

{
  iterator iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Camera *this;
  mapped_type *ppCVar5;
  pointer ppVar6;
  _Self local_28;
  _Self local_20;
  iterator it;
  Camera *cam;
  string *_name_local;
  
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*>_>_>
               *)(scene + 0x98),_name);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*>_>_>
              *)(scene + 0x98));
  bVar2 = std::operator==(&local_20,&local_28);
  if (bVar2) {
    this = (Camera *)operator_new(0x260);
    Camera::Camera(this);
    it._M_node = (_Base_ptr)this;
    ppCVar5 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*>_>_>
                            *)(scene + 0x98),_name);
    *ppCVar5 = this;
  }
  else {
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*>_>
             ::operator->(&local_20);
    it._M_node = (_Base_ptr)ppVar6->second;
  }
  iVar1._M_node = it._M_node;
  iVar3 = getWindowWidth();
  iVar4 = getWindowHeight();
  (**(code **)(*(long *)iVar1._M_node + 0x1f0))(iVar1._M_node,iVar3,iVar4);
  glEnable(0xb71);
  return (Camera *)it._M_node;
}

Assistant:

Camera* createCamera(const std::string& _name) {
    Camera* cam;
    CamerasMap::iterator it = scene->cameras.find(_name);
    if (it == scene->cameras.end()) {
        cam = new Camera();
        scene->cameras[_name] = cam;
    }
    else 
        cam = it->second;

    cam->setViewport(getWindowWidth(), getWindowHeight());
    glEnable(GL_DEPTH_TEST);
    return cam;
}